

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::syntax::InstanceNameSyntax_const&>
          (BumpAllocator *this,InstanceNameSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  InstanceNameSyntax *pIVar8;
  
  pIVar8 = (InstanceNameSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceNameSyntax *)this->endPtr < pIVar8 + 1) {
    pIVar8 = (InstanceNameSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pIVar8 + 1);
  }
  (pIVar8->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pIVar8->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pIVar8->super_SyntaxNode).field_0x4 = uVar4;
  (pIVar8->super_SyntaxNode).parent = pSVar1;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  pIVar2 = (args->name).info;
  (pIVar8->name).kind = (args->name).kind;
  (pIVar8->name).field_0x2 = uVar5;
  (pIVar8->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar8->name).rawLen = uVar7;
  (pIVar8->name).info = pIVar2;
  uVar4 = *(undefined4 *)&(args->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->dimensions).super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar8->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->dimensions).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pIVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005dad10;
  (pIVar8->dimensions).super_SyntaxListBase.childCount =
       (args->dimensions).super_SyntaxListBase.childCount;
  sVar3 = (args->dimensions).
          super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_ptr = (args->dimensions).
           super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar8->dimensions).super_span<slang::syntax::VariableDimensionSyntax_*,_18446744073709551615UL>.
  _M_extent._M_extent_value = sVar3;
  (pIVar8->dimensions).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005daf38;
  return pIVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }